

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastTable(Gia_Man_t *pNew,word *pTable,int *pFans,int nFans,int nOuts,Vec_Int_t *vRes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *vMemory;
  ulong *pTruth;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  Vec_Int_t vLeaves;
  Vec_Int_t local_40;
  
  vMemory = (Vec_Int_t *)calloc(1,0x10);
  iVar1 = 1 << ((byte)nFans - 6 & 0x1f);
  if (nFans < 7) {
    iVar1 = 1;
  }
  local_40.nCap = nFans;
  local_40.nSize = nFans;
  local_40.pArray = pFans;
  pTruth = (ulong *)malloc((long)iVar1 << 3);
  vRes->nSize = 0;
  if (0 < nOuts) {
    uVar10 = 1 << ((byte)nFans & 0x1f);
    iVar2 = 3;
    if (3 < (uint)nFans) {
      iVar2 = nFans;
    }
    if ((int)uVar10 < 2) {
      uVar10 = 1;
    }
    iVar9 = 0;
    do {
      memset(pTruth,0,(long)iVar1 << 3);
      if (nFans != 0x1f) {
        uVar5 = 0;
        uVar7 = 0;
        do {
          iVar4 = (int)uVar5;
          if (0 < nFans) {
            iVar11 = nFans;
            do {
              if ((pTable[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) {
                pTruth[uVar7 >> 6] = pTruth[uVar7 >> 6] | 1L << ((byte)uVar7 & 0x3f);
              }
              uVar5 = (ulong)((int)uVar5 + 1);
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          uVar7 = uVar7 + 1;
          uVar5 = (ulong)(uint)(iVar4 + nFans);
        } while (uVar7 != uVar10);
        if (nFans < 6) {
          if (nFans < 0) {
            __assert_fail("nVars >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x489,"word Abc_Tt6Stretch(word, int)");
          }
          uVar5 = *pTruth;
          uVar3 = (uint)uVar5;
          uVar7 = -(uVar3 & 1);
          if (nFans != 0) {
            uVar7 = uVar3;
          }
          uVar7 = (uVar7 & 3) * 5;
          if (1 < (uint)nFans) {
            uVar7 = uVar3;
          }
          bVar6 = (byte)(uVar7 << 4) | (byte)uVar7 & 0xf;
          if (2 < (uint)nFans) {
            bVar6 = (byte)uVar5;
          }
          uVar8 = (ulong)CONCAT11(bVar6,bVar6);
          if (3 < (uint)nFans) {
            uVar8 = uVar5;
          }
          uVar5 = (ulong)((uint)uVar8 << 0x10 | (uint)uVar8 & 0xffff);
          if (1 < iVar2 - 3U) {
            uVar5 = uVar8;
          }
          *pTruth = uVar5 << 0x20 | uVar5 & 0xffffffff;
        }
      }
      iVar4 = Kit_TruthToGia(pNew,(uint *)pTruth,nFans,vMemory,&local_40,1);
      Vec_IntPush(vRes,iVar4);
      iVar9 = iVar9 + 1;
    } while (iVar9 != nOuts);
    if (vMemory->pArray != (int *)0x0) {
      free(vMemory->pArray);
    }
  }
  free(vMemory);
  if (pTruth != (ulong *)0x0) {
    free(pTruth);
  }
  return;
}

Assistant:

void Wlc_BlastTable( Gia_Man_t * pNew, word * pTable, int * pFans, int nFans, int nOuts, Vec_Int_t * vRes )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 0 );
    Vec_Int_t vLeaves = { nFans, nFans, pFans };
    word * pTruth = ABC_ALLOC( word, Abc_TtWordNum(nFans) );
    int o, i, m, iLit, nMints = (1 << nFans);
    Vec_IntClear( vRes );
    for ( o = 0; o < nOuts; o++ )
    {
        // derive truth table
        memset( pTruth, 0, sizeof(word) * Abc_TtWordNum(nFans) );
        for ( m = 0; m < nMints; m++ )
            for ( i = 0; i < nFans; i++ )
                if ( Abc_TtGetBit( pTable, m * nFans + i ) )
                    Abc_TtSetBit( pTruth, m );
        // implement truth table
        if ( nFans < 6 )
            pTruth[0] = Abc_Tt6Stretch( pTruth[0], nFans );
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, nFans, vMemory, &vLeaves, 1 );
        Vec_IntPush( vRes, iLit );
    }
    Vec_IntFree( vMemory );
    ABC_FREE( pTruth );
}